

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall Am_Object::Destroy(Am_Object *this)

{
  uint *puVar1;
  Am_Object_Data *pAVar2;
  Am_Object_Data *in_RAX;
  Am_Object_Data **ppAVar3;
  Am_Object_Data **ppAVar4;
  Am_Object_Data *pAVar5;
  Am_Object local_28;
  
  pAVar5 = this->data;
  if (pAVar5 != (Am_Object_Data *)0x0) {
    local_28.data = in_RAX;
    if ((pAVar5->owner_slot).super_Am_Value.value.wrapper_value != (Am_Wrapper *)0x0) {
      Remove_From_Owner(this);
      pAVar5 = this->data;
    }
    if ((pAVar5->super_Am_Wrapper).refs != 1) {
      ppAVar4 = &pAVar5->first_instance;
      ppAVar3 = ppAVar4;
      while (pAVar5 = *ppAVar3, pAVar5 != (Am_Object_Data *)0x0) {
        puVar1 = &(pAVar5->super_Am_Wrapper).refs;
        *puVar1 = *puVar1 + 1;
        ppAVar3 = &pAVar5->next_instance;
      }
      pAVar5 = *ppAVar4;
      *ppAVar4 = (Am_Object_Data *)0x0;
      while (pAVar5 != (Am_Object_Data *)0x0) {
        pAVar2 = pAVar5->next_instance;
        puVar1 = &(pAVar5->super_Am_Wrapper).refs;
        *puVar1 = *puVar1 + 1;
        local_28.data = pAVar5;
        Destroy(&local_28);
        ~Am_Object(&local_28);
        Am_Wrapper::Release(&pAVar5->super_Am_Wrapper);
        pAVar5 = pAVar2;
      }
      pAVar5 = this->data;
      if ((pAVar5->data).data != (char *)0x0) {
        Am_Object_Data::destroy_object(pAVar5);
        pAVar5 = this->data;
      }
    }
    Am_Wrapper::Release(&pAVar5->super_Am_Wrapper);
    this->data = (Am_Object_Data *)0x0;
  }
  return;
}

Assistant:

void
Am_Object::Destroy()
{
#ifdef DEBUG
  Global_Call_Object_Trace(*this, Am_No_Object, Am_TRACE_OBJECT_DESTROYED);
#endif

  if (!data)
    return;

  if (data->owner_slot.value.wrapper_value)
    Remove_From_Owner();

  if (!data->Is_Unique()) {
    Am_Object_Data *current;
    Am_Object_Data *next;

    for (current = data->first_instance; current != nullptr;
         current = current->next_instance)
      current->Note_Reference(); // 1

    current = data->first_instance;
    data->first_instance = nullptr;
    for (; current != nullptr; current = next) {
      next = current->next_instance;
      current->Note_Reference();    // 2
      Am_Object(current).Destroy(); // 2
      current->Release();           // 1
    }

    if (data->data.data)
      data->destroy_object();
  }

  data->Release();
  data = nullptr;
}